

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

float_t __thiscall djb::beckmann::qf2(beckmann *this,float_t u,float_t zi,float_t z_i)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float_t fVar4;
  double dVar5;
  undefined1 auVar6 [16];
  float_t derivative;
  float_t value;
  float_t invErf;
  int it;
  float_t nrm;
  float_t b;
  float_t fit;
  float_t ti;
  float_t c;
  float_t a;
  float_t tti;
  float_t cti;
  float_t sqrt_pi_inv;
  float_t z_i_local;
  float_t zi_local;
  float_t u_local;
  beckmann *this_local;
  undefined1 extraout_var [12];
  
  cti = z_i;
  sqrt_pi_inv = zi;
  z_i_local = u;
  _zi_local = this;
  if ((u != 0.0) || (NAN(u))) {
    if ((u != 1.0) || (NAN(u))) {
      auVar6._0_4_ = m_pi();
      auVar6._4_12_ = extraout_var;
      dVar5 = std::sqrt(auVar6._0_8_);
      tti = 1.0 / SUB84(dVar5,0);
      a = sqrt_pi_inv / cti;
      fVar1 = cti / sqrt_pi_inv;
      ti = -1.0;
      dVar5 = std::erf((double)(ulong)(uint)a);
      fit = SUB84(dVar5,0);
      dVar5 = std::acos((double)(ulong)(uint)sqrt_pi_inv);
      fVar2 = SUB84(dVar5,0);
      dVar5 = std::pow((double)(ulong)(uint)(1.0 - z_i_local),
                       (double)(ulong)(uint)(fVar2 * (fVar2 * (fVar2 * -0.0594 + 0.4265) + -0.876) +
                                            1.0));
      it = (int)(-(fit + 1.0) * SUB84(dVar5,0) + fit);
      if (cti <= 0.0) {
        fVar2 = fit + 1.0;
      }
      else {
        fVar2 = tti * fVar1;
        fVar3 = sqr<float>(&a);
        dVar5 = std::exp((double)(ulong)(uint)-fVar3);
        fVar2 = fVar2 * SUB84(dVar5,0) + fit + 1.0;
      }
      invErf = 1.0 / fVar2;
      value = 0.0;
      while (value = (float_t)((int)value + 1), (int)value < 10) {
        if (((float)it < ti) || (fit < (float)it)) {
          it = (int)((ti + fit) * 0.5);
        }
        fVar4 = erfinv((float_t)it);
        fVar2 = tti * fVar1;
        dVar5 = std::exp((double)(ulong)(uint)(-fVar4 * fVar4));
        fVar2 = invErf * (fVar2 * SUB84(dVar5,0) + (float)it + 1.0) + -z_i_local;
        dVar5 = std::fabs((double)(ulong)(uint)fVar2);
        if (SUB84(dVar5,0) < 1e-05) break;
        if (fVar2 <= 0.0) {
          ti = (float_t)it;
        }
        else {
          fit = (float_t)it;
        }
        it = (int)((float)it - fVar2 / (invErf * (-fVar4 * fVar1 + 1.0)));
      }
      this_local._4_4_ = erfinv((float_t)it);
    }
    else {
      this_local._4_4_ = std::numeric_limits<float>::infinity();
    }
  }
  else {
    fVar1 = std::numeric_limits<float>::infinity();
    this_local._4_4_ = -fVar1;
  }
  return this_local._4_4_;
}

Assistant:

float_t beckmann::qf2(float_t u, float_t zi, float_t z_i) const
{
	if (u == 0)
		return -std::numeric_limits<float>::infinity();
	else if (u == 1)
		return +std::numeric_limits<float>::infinity();
	else {
		const float_t sqrt_pi_inv = 1 / sqrt(m_pi());

		/* The original inversion routine from the paper contained
		   discontinuities, which causes issues for QMC integration
		   and techniques like Kelemen-style MLT. The following code
		   performs a numerical inversion with better behavior */
		float_t cti = zi / z_i;
		float_t tti = z_i / zi;

		/* Search interval -- everything is parameterized
		   in the erf() domain */
		float_t a = -1, c = std::erf(cti);

		/* Start with a good initial guess */
		/* We can do better (inverse of an approximation computed in Mathematica) */
		float_t ti = acos(zi);
		float_t fit = 1 + ti * (-0.876f + ti * (0.4265f - 0.0594f * ti));
		float_t b = c - (1 + c) * std::pow(1 - u, fit);

		/* Normalization factor for the CDF */
		float_t nrm;
		if (z_i > 0)
			nrm = 1 / (1 + c + sqrt_pi_inv * tti * exp(-sqr(cti)));
		else
			nrm = 1 / (1 + c);

		int it = 0;
		while (++it < 10) {
			/* Bisection criterion -- the oddly-looking
			   boolean expression are intentional to check
			   for NaNs at little additional cost */
			if (!(b >= a && b <= c))
				b = 0.5f * (a + c);

			/* Evaluate the CDF and its derivative
			   (i.e. the density function) */
			float_t invErf = erfinv(b);
			float_t value = nrm * (1 + b + sqrt_pi_inv *
				tti * std::exp(-invErf * invErf)) - u;
			float_t derivative = nrm * (1 - invErf * tti);

			if (fabs(value) < 1e-5f)
				break;

			/* Update bisection intervals */
			if (value > 0)
				c = b;
			else
				a = b;

			b -= value / derivative;
		}

		/* Now convert back into a slope value */
		return erfinv(b);
	}
}